

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::getSentenceVector(FastText *this,istream *in,Vector *svec)

{
  element_type *peVar1;
  ulong uVar2;
  istream *piVar3;
  int iVar4;
  int32_t i;
  ulong uVar5;
  real rVar6;
  vector<int,_std::allocator<int>_> labels;
  Vector vec;
  string word;
  vector<int,_std::allocator<int>_> line;
  
  Vector::zero(svec);
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->model == sup) {
    line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,&line,&labels);
    uVar5 = 0;
    while( true ) {
      uVar2 = (long)line.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)line.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      if (uVar2 <= uVar5) break;
      addInputVector(this,svec,
                     line.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5]);
      uVar5 = uVar5 + 1;
    }
    if (line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      Vector::mul(svec,(float)(1.0 / (double)(long)uVar2));
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&labels.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&line.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    Vector::Vector(&vec,(long)peVar1->dim);
    labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((ulong)labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&labels);
    std::__cxx11::istringstream::istringstream((istringstream *)&line,(string *)&labels,_S_in);
    word._M_dataplus._M_p = (pointer)&word.field_2;
    word._M_string_length = 0;
    word.field_2._M_local_buf[0] = '\0';
    iVar4 = 0;
    while( true ) {
      piVar3 = std::operator>>((istream *)&line,(string *)&word);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      getWordVector(this,&vec,&word);
      rVar6 = Vector::norm(&vec);
      if (0.0 < rVar6) {
        Vector::mul(&vec,1.0 / rVar6);
        Vector::addVector(svec,&vec);
        iVar4 = iVar4 + 1;
      }
    }
    if (iVar4 != 0) {
      Vector::mul(svec,1.0 / (float)iVar4);
    }
    std::__cxx11::string::~string((string *)&word);
    std::__cxx11::istringstream::~istringstream((istringstream *)&line);
    std::__cxx11::string::~string((string *)&labels);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&vec);
  }
  return;
}

Assistant:

void FastText::getSentenceVector(
    std::istream& in,
    fasttext::Vector& svec) {
  svec.zero();
  if (args_->model == model_name::sup) {
    std::vector<int32_t> line, labels;
    dict_->getLine(in, line, labels);
    for (int32_t i = 0; i < line.size(); i++) {
      addInputVector(svec, line[i]);
    }
    if (!line.empty()) {
      svec.mul(1.0 / line.size());
    }
  } else {
    Vector vec(args_->dim);
    std::string sentence;
    std::getline(in, sentence);
    std::istringstream iss(sentence);
    std::string word;
    int32_t count = 0;
    while (iss >> word) {
      getWordVector(vec, word);
      real norm = vec.norm();
      if (norm > 0) {
        vec.mul(1.0 / norm);
        svec.addVector(vec);
        count++;
      }
    }
    if (count > 0) {
      svec.mul(1.0 / count);
    }
  }
}